

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O2

deBool deStringBeginsWith(char *str,char *lead)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char *b;
  char *a;
  
  lVar3 = 0;
  do {
    pcVar1 = lead + lVar3;
    if (*pcVar1 == '\0') {
      return 1;
    }
    pcVar2 = str + lVar3;
    lVar3 = lVar3 + 1;
  } while (*pcVar2 == *pcVar1);
  return 0;
}

Assistant:

deBool deStringBeginsWith (const char* str, const char* lead)
{
	const char* a = str;
	const char* b = lead;

	while (*b)
	{
		if (*a++ != *b++)
			return DE_FALSE;
	}

	return DE_TRUE;
}